

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

void __thiscall Assimp::ExporterPimpl::ExporterPimpl(ExporterPimpl *this)

{
  DefaultIOSystem *this_00;
  size_t in_RSI;
  ExporterPimpl *this_local;
  
  this->blob = (aiExportDataBlob *)0x0;
  this_00 = (DefaultIOSystem *)
            Intern::AllocateFromAssimpHeap::operator_new((AllocateFromAssimpHeap *)0x20,in_RSI);
  (this_00->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_IOSystem)._vptr_IOSystem = (_func_int **)0x0;
  (this_00->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  DefaultIOSystem::DefaultIOSystem(this_00);
  std::shared_ptr<Assimp::IOSystem>::shared_ptr<Assimp::DefaultIOSystem,void>
            (&this->mIOSystem,this_00);
  this->mIsDefaultIOHandler = true;
  this->mProgressHandler = (ProgressHandler *)0x0;
  this->mIsDefaultProgressHandler = true;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPostProcessingSteps).
  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::vector
            (&this->mPostProcessingSteps);
  std::__cxx11::string::string((string *)&this->mError);
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mExporters).
  super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::vector(&this->mExporters);
  GetPostProcessingStepInstanceList(&this->mPostProcessingSteps);
  setupExporterArray(&this->mExporters);
  return;
}

Assistant:

ExporterPimpl()
    : blob()
    , mIOSystem(new Assimp::DefaultIOSystem())
    , mIsDefaultIOHandler(true)
    , mProgressHandler( nullptr )
    , mIsDefaultProgressHandler( true )
    , mPostProcessingSteps()
    , mError()
    , mExporters() {
        GetPostProcessingStepInstanceList(mPostProcessingSteps);

        // grab all built-in exporters
		setupExporterArray(mExporters);
    }